

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5BufferSize(int *pRc,Fts5Buffer *pBuf,u32 nByte)

{
  uint uVar1;
  ulong uVar2;
  u8 *puVar3;
  uint uVar4;
  ulong n;
  int iVar5;
  
  uVar1 = pBuf->nSpace;
  iVar5 = 0;
  if (uVar1 < nByte) {
    uVar4 = 0x40;
    if (uVar1 != 0) {
      uVar4 = uVar1;
    }
    uVar2 = (long)(int)uVar4;
    do {
      n = uVar2;
      uVar2 = n * 2;
    } while (n < nByte);
    puVar3 = (u8 *)sqlite3_realloc64(pBuf->p,n);
    if (puVar3 == (u8 *)0x0) {
      *pRc = 7;
      iVar5 = 1;
    }
    else {
      pBuf->nSpace = (int)n;
      pBuf->p = puVar3;
    }
  }
  return iVar5;
}

Assistant:

static int sqlite3Fts5BufferSize(int *pRc, Fts5Buffer *pBuf, u32 nByte){
  if( (u32)pBuf->nSpace<nByte ){
    u64 nNew = pBuf->nSpace ? pBuf->nSpace : 64;
    u8 *pNew;
    while( nNew<nByte ){
      nNew = nNew * 2;
    }
    pNew = sqlite3_realloc64(pBuf->p, nNew);
    if( pNew==0 ){
      *pRc = SQLITE_NOMEM;
      return 1;
    }else{
      pBuf->nSpace = (int)nNew;
      pBuf->p = pNew;
    }
  }
  return 0;
}